

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void pack_16x9_pixels(uint16_t *src,ptrdiff_t pitch,__m256i *sig)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 (*pauVar10) [32];
  undefined1 (*pauVar11) [32];
  long in_RDX;
  long in_RSI;
  long in_RDI;
  __m256i u3;
  __m256i u2;
  __m256i u1;
  __m256i u0;
  __m256i s8;
  __m256i s7;
  
  pauVar10 = (undefined1 (*) [32])(in_RDI + in_RSI * 0xe);
  pauVar11 = (undefined1 (*) [32])(in_RDI + in_RSI * 0x10);
  uVar6 = *(undefined8 *)*pauVar11;
  uVar7 = *(undefined8 *)(*pauVar11 + 8);
  uVar8 = *(undefined8 *)(*pauVar11 + 0x10);
  uVar9 = *(undefined8 *)(*pauVar11 + 0x18);
  auVar2 = vperm2i128_avx2(*(undefined1 (*) [32])(in_RDX + 0x200),*pauVar10,0x20);
  auVar3 = vperm2i128_avx2(*(undefined1 (*) [32])(in_RDX + 0x200),*pauVar10,0x31);
  auVar4 = vperm2i128_avx2(*pauVar10,*pauVar11,0x20);
  auVar5 = vperm2i128_avx2(*pauVar10,*pauVar11,0x31);
  auVar1 = vpunpcklwd_avx2(auVar2,auVar4);
  *(undefined1 (*) [32])(in_RDX + 0x60) = auVar1;
  auVar1 = vpunpckhwd_avx2(auVar2,auVar4);
  *(undefined1 (*) [32])(in_RDX + 0xe0) = auVar1;
  auVar1 = vpunpcklwd_avx2(auVar3,auVar5);
  *(undefined1 (*) [32])(in_RDX + 0x160) = auVar1;
  auVar1 = vpunpckhwd_avx2(auVar3,auVar5);
  *(undefined1 (*) [32])(in_RDX + 0x1e0) = auVar1;
  *(undefined8 *)(in_RDX + 0x200) = uVar6;
  *(undefined8 *)(in_RDX + 0x208) = uVar7;
  *(undefined8 *)(in_RDX + 0x210) = uVar8;
  *(undefined8 *)(in_RDX + 0x218) = uVar9;
  return;
}

Assistant:

static void pack_16x9_pixels(const uint16_t *src, ptrdiff_t pitch,
                             __m256i *sig) {
  // base + 7th row
  const __m256i s7 = _mm256_loadu_si256((const __m256i *)(src + 7 * pitch));
  // base + 8th row
  const __m256i s8 = _mm256_loadu_si256((const __m256i *)(src + 8 * pitch));

  __m256i u0, u1, u2, u3;
  u0 = _mm256_permute2x128_si256(sig[16], s7, 0x20);
  u1 = _mm256_permute2x128_si256(sig[16], s7, 0x31);

  u2 = _mm256_permute2x128_si256(s7, s8, 0x20);
  u3 = _mm256_permute2x128_si256(s7, s8, 0x31);

  sig[3] = _mm256_unpacklo_epi16(u0, u2);
  sig[7] = _mm256_unpackhi_epi16(u0, u2);

  sig[11] = _mm256_unpacklo_epi16(u1, u3);
  sig[15] = _mm256_unpackhi_epi16(u1, u3);

  sig[16] = s8;
}